

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O3

bool leveldb::ParseFileName(string *filename,uint64_t *number,FileType *type)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  FileType FVar4;
  long in_FS_OFFSET;
  uint64_t num;
  Slice rest;
  uint64_t local_30;
  Slice local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.data_ = (filename->_M_dataplus)._M_p;
  local_28.size_ = filename->_M_string_length;
  if (local_28.size_ == 3) {
    pcVar1 = "/LOG";
LAB_0066639b:
    iVar3 = bcmp(local_28.data_,pcVar1 + 1,local_28.size_);
    if (iVar3 != 0) {
LAB_006663d7:
      bVar2 = ConsumeDecimalNumber(&local_28,&local_30);
      if (bVar2) {
        if (local_28.size_ == 6) {
          iVar3 = bcmp(local_28.data_,".dbtmp",6);
          if (iVar3 == 0) {
            FVar4 = kTempFile;
            goto LAB_00666482;
          }
        }
        else if (local_28.size_ == 4) {
          if (*(int *)local_28.data_ == 0x676f6c2e) {
            FVar4 = kLogFile;
          }
          else {
            FVar4 = kTableFile;
            if ((*(int *)local_28.data_ != 0x7473732e) && (*(int *)local_28.data_ != 0x62646c2e))
            goto LAB_0066642f;
          }
LAB_00666482:
          *type = FVar4;
          goto LAB_00666485;
        }
      }
LAB_0066642f:
      bVar2 = false;
      goto LAB_0066648f;
    }
    *number = 0;
    *type = kInfoLogFile;
  }
  else if (local_28.size_ == 4) {
    iVar3 = bcmp(local_28.data_,"LOCK",4);
    if (iVar3 != 0) goto LAB_006663d7;
    *number = 0;
    *type = kDBLockFile;
  }
  else if (local_28.size_ == 7) {
    if (*(int *)((long)local_28.data_ + 3) != 0x544e4552 ||
        (int)*(long *)local_28.data_ != 0x52525543) {
      pcVar1 = "/LOG.old";
      goto LAB_0066639b;
    }
    *number = 0;
    *type = kCurrentFile;
  }
  else {
    if ((local_28.size_ < 9) ||
       ((char)*(long *)((long)local_28.data_ + 8) != '-' ||
        *(long *)local_28.data_ != 0x54534546494e414d)) goto LAB_006663d7;
    local_28.data_ = (char *)((long)local_28.data_ + 9);
    local_28.size_ = local_28.size_ - 9;
    bVar2 = ConsumeDecimalNumber(&local_28,&local_30);
    if ((!bVar2) || (local_28.size_ != 0)) goto LAB_0066642f;
    *type = kDescriptorFile;
LAB_00666485:
    *number = local_30;
  }
  bVar2 = true;
LAB_0066648f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool ParseFileName(const std::string& filename, uint64_t* number,
                   FileType* type) {
  Slice rest(filename);
  if (rest == "CURRENT") {
    *number = 0;
    *type = kCurrentFile;
  } else if (rest == "LOCK") {
    *number = 0;
    *type = kDBLockFile;
  } else if (rest == "LOG" || rest == "LOG.old") {
    *number = 0;
    *type = kInfoLogFile;
  } else if (rest.starts_with("MANIFEST-")) {
    rest.remove_prefix(strlen("MANIFEST-"));
    uint64_t num;
    if (!ConsumeDecimalNumber(&rest, &num)) {
      return false;
    }
    if (!rest.empty()) {
      return false;
    }
    *type = kDescriptorFile;
    *number = num;
  } else {
    // Avoid strtoull() to keep filename format independent of the
    // current locale
    uint64_t num;
    if (!ConsumeDecimalNumber(&rest, &num)) {
      return false;
    }
    Slice suffix = rest;
    if (suffix == Slice(".log")) {
      *type = kLogFile;
    } else if (suffix == Slice(".sst") || suffix == Slice(".ldb")) {
      *type = kTableFile;
    } else if (suffix == Slice(".dbtmp")) {
      *type = kTempFile;
    } else {
      return false;
    }
    *number = num;
  }
  return true;
}